

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

void __thiscall
spvtools::val::Function::RegisterBlockEnd
          (Function *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *next_list)

{
  bool bVar1;
  size_type __n;
  reference puVar2;
  pointer ppVar3;
  Construct *this_00;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *this_01;
  reference ppCVar4;
  value_type *__x;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>,_bool>
  pVar5;
  BasicBlock *local_200;
  BasicBlock *continue_target;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
  *next_blocks_plus_continue_target;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *local_1e8;
  _Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>
  local_1d8 [2];
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false> local_1c8;
  undefined1 local_1c0;
  BasicBlock local_1b8;
  pair<const_unsigned_int,_spvtools::val::BasicBlock> local_118;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>,_bool>
  local_70;
  undefined1 local_5c [8];
  uint32_t successor_id;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  bool success;
  iterator inserted_block;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> next_blocks;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *next_list_local;
  Function *this_local;
  
  if (this->current_block_ != (BasicBlock *)0x0) {
    std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::vector
              ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
               &inserted_block);
    __n = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(next_list);
    std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::reserve
              ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
               &inserted_block,__n);
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>::
    _Node_iterator((_Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>
                    *)&stack0xffffffffffffffc8);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(next_list);
    register0x00000000 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(next_list);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)(local_5c + 4)), bVar1) {
      puVar2 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
      local_5c._0_4_ = *puVar2;
      BasicBlock::BasicBlock(&local_1b8,local_5c._0_4_);
      std::pair<const_unsigned_int,_spvtools::val::BasicBlock>::
      pair<unsigned_int_&,_spvtools::val::BasicBlock,_true>(&local_118,(uint *)local_5c,&local_1b8);
      pVar5 = std::
              unordered_map<unsigned_int,_spvtools::val::BasicBlock,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>_>
              ::insert(&this->blocks_,&local_118);
      local_1c8._M_cur =
           (__node_type *)
           pVar5.first.
           super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
           ._M_cur;
      local_1c0 = pVar5.second;
      local_70.first.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
               )(_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                 )local_1c8._M_cur;
      local_70.second = (bool)local_1c0;
      std::
      tie<std::__detail::_Node_iterator<std::pair<unsigned_int_const,spvtools::val::BasicBlock>,false,false>,bool>
                (local_1d8,(bool *)&stack0xffffffffffffffc8);
      std::
      tuple<std::__detail::_Node_iterator<std::pair<unsigned_int_const,spvtools::val::BasicBlock>,false,false>&,bool&>
      ::operator=((tuple<std::__detail::_Node_iterator<std::pair<unsigned_int_const,spvtools::val::BasicBlock>,false,false>&,bool&>
                   *)local_1d8,&local_70);
      std::pair<const_unsigned_int,_spvtools::val::BasicBlock>::~pair(&local_118);
      BasicBlock::~BasicBlock(&local_1b8);
      if ((__range2._7_1_ & 1) != 0) {
        local_1e8 = std::
                    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *
                             )&this->undefined_blocks_,
                             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)local_5c,__x);
      }
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>
                             *)&stack0xffffffffffffffc8);
      next_blocks_plus_continue_target =
           (vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
           &ppVar3->second;
      std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
      push_back((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *
                )&inserted_block,(value_type *)&next_blocks_plus_continue_target);
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end2);
    }
    bVar1 = BasicBlock::is_type(this->current_block_,kBlockTypeLoop);
    if (bVar1) {
      continue_target =
           (BasicBlock *)
           std::
           unordered_map<const_spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
           ::operator[](&this->loop_header_successors_plus_continue_target_map_,
                        &this->current_block_);
      std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
      operator=((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *
                )continue_target,
                (vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *
                )&inserted_block);
      this_00 = FindConstructForEntryBlock(this,this->current_block_,kLoop);
      this_01 = Construct::corresponding_constructs(this_00);
      ppCVar4 = std::vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                ::back(this_01);
      local_200 = Construct::entry_block(*ppCVar4);
      if (local_200 != this->current_block_) {
        std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
        push_back((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                   *)continue_target,&local_200);
      }
    }
    BasicBlock::RegisterSuccessors
              (this->current_block_,
               (vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
               &inserted_block);
    this->current_block_ = (BasicBlock *)0x0;
    std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::~vector
              ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
               &inserted_block);
    return;
  }
  __assert_fail("current_block_ && \"RegisterBlockEnd can only be called when parsing a binary in a block\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/function.cpp"
                ,0x91,"void spvtools::val::Function::RegisterBlockEnd(std::vector<uint32_t>)");
}

Assistant:

void Function::RegisterBlockEnd(std::vector<uint32_t> next_list) {
  assert(
      current_block_ &&
      "RegisterBlockEnd can only be called when parsing a binary in a block");
  std::vector<BasicBlock*> next_blocks;
  next_blocks.reserve(next_list.size());

  std::unordered_map<uint32_t, BasicBlock>::iterator inserted_block;
  bool success;
  for (uint32_t successor_id : next_list) {
    tie(inserted_block, success) =
        blocks_.insert({successor_id, BasicBlock(successor_id)});
    if (success) {
      undefined_blocks_.insert(successor_id);
    }
    next_blocks.push_back(&inserted_block->second);
  }

  if (current_block_->is_type(kBlockTypeLoop)) {
    // For each loop header, record the set of its successors, and include
    // its continue target if the continue target is not the loop header
    // itself.
    std::vector<BasicBlock*>& next_blocks_plus_continue_target =
        loop_header_successors_plus_continue_target_map_[current_block_];
    next_blocks_plus_continue_target = next_blocks;
    auto continue_target =
        FindConstructForEntryBlock(current_block_, ConstructType::kLoop)
            .corresponding_constructs()
            .back()
            ->entry_block();
    if (continue_target != current_block_) {
      next_blocks_plus_continue_target.push_back(continue_target);
    }
  }

  current_block_->RegisterSuccessors(next_blocks);
  current_block_ = nullptr;
  return;
}